

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reducer_impl.cpp
# Opt level: O1

elem * __thiscall
cilkred_map::insert_no_rehash
          (cilkred_map *this,__cilkrts_worker *w,void *key,__cilkrts_hyperobject_base *hb,void *view
          )

{
  ulong uVar1;
  elem *peVar2;
  
  if ((w == (__cilkrts_worker *)0x0 && this->g == (global_state_t *)0x0) || (w->g == this->g)) {
    if (key == (void *)0x0) {
      insert_no_rehash();
    }
    else if (view != (void *)0x0) {
      uVar1 = (ulong)key >> 0x15 ^ (ulong)key;
      uVar1 = uVar1 >> 8 ^ uVar1;
      peVar2 = grow(w,this->buckets + (this->nbuckets - 1 & (uVar1 >> 3 ^ uVar1)));
      peVar2->key = key;
      peVar2->hb = hb;
      peVar2->view = view;
      this->nelem = this->nelem + 1;
      return peVar2;
    }
    insert_no_rehash();
  }
  insert_no_rehash();
}

Assistant:

elem *cilkred_map::insert_no_rehash(__cilkrts_worker           *w,
				    void                       *key,
				    __cilkrts_hyperobject_base *hb,
                                    void                       *view)
{

#if REDPAR_DEBUG >= 2
    fprintf(stderr, "[W=%d, desc=insert_no_rehash, this_map=%p]\n",
	    w->self, this);
    verify_current_wkr(w);
#endif
    
    CILK_ASSERT((w == 0 && g == 0) || w->g == g);
    CILK_ASSERT(key != 0);
    CILK_ASSERT(view != 0);
	    
    elem *el = grow(w, &(buckets[hashfun(this, key)]));

#if REDPAR_DEBUG >= 3
    fprintf(stderr, "[W=%d, this=%p, inserting key=%p, view=%p, el = %p]\n",
	    w->self, this, key, view, el);
#endif

    el->key = key;
    el->hb  = hb;
    el->view = view;
    ++nelem;

    return el;
}